

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::BinaryOperator::isResolved(BinaryOperator *this)

{
  bool bVar1;
  bool bVar2;
  Expression *pEVar3;
  bool local_32;
  Type local_30;
  BinaryOperator *local_18;
  BinaryOperator *this_local;
  
  local_18 = this;
  pEVar3 = pool_ref<soul::AST::Expression>::get(&this->lhs);
  bVar2 = isResolvedAsValue(pEVar3);
  bVar1 = false;
  local_32 = false;
  if (bVar2) {
    pEVar3 = pool_ref<soul::AST::Expression>::get(&this->rhs);
    bVar2 = isResolvedAsValue(pEVar3);
    local_32 = false;
    if (bVar2) {
      (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&local_30);
      bVar1 = true;
      local_32 = Type::isValid(&local_30);
    }
  }
  this_local._7_1_ = local_32;
  if (bVar1) {
    Type::~Type(&local_30);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool isResolved() const override            { return isResolvedAsValue (lhs.get()) && isResolvedAsValue (rhs.get()) && getResultType().isValid(); }